

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

bool __thiscall CMU462::StaticScene::BVHAccel::intersect(BVHAccel *this,Ray *ray,Intersection *i)

{
  uint uVar1;
  size_type sVar2;
  const_reference ppPVar3;
  ulong local_30;
  size_t p;
  bool hit;
  Intersection *i_local;
  Ray *ray_local;
  BVHAccel *this_local;
  
  p._7_1_ = false;
  for (local_30 = 0;
      sVar2 = std::
              vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
              ::size(&(this->super_Aggregate).primitives), local_30 < sVar2; local_30 = local_30 + 1
      ) {
    ppPVar3 = std::
              vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
              ::operator[](&(this->super_Aggregate).primitives,local_30);
    uVar1 = (*(*ppPVar3)->_vptr_Primitive[2])(*ppPVar3,ray,i);
    if ((uVar1 & 1) != 0) {
      p._7_1_ = true;
    }
  }
  return p._7_1_;
}

Assistant:

bool BVHAccel::intersect(const Ray &ray, Intersection *i) const {

    // TODO:
    // Implement ray - bvh aggregate intersection test. A ray intersects
    // with a BVH aggregate if and only if it intersects a primitive in
    // the BVH that is not an aggregate. When an intersection does happen.
    // You should store the non-aggregate primitive in the intersection data
    // and not the BVH aggregate itself.

    bool hit = false;
    for (size_t p = 0; p < primitives.size(); ++p) {
      if(primitives[p]->intersect(ray, i)) hit = true;
    }

    return hit;

  }